

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void suffixedexp(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *fs;
  expdesc key;
  
  fs = ls->fs;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x123) {
    singlevar(ls,v);
  }
  else {
    if (iVar1 != 0x28) {
      luaX_syntaxerror(ls,"unexpected symbol");
    }
    iVar1 = ls->linenumber;
    luaX_next(ls);
    expr(ls,v);
    check_match(ls,0x29,0x28,iVar1);
    luaK_dischargevars(ls->fs,v);
  }
  do {
    while ((iVar1 = (ls->t).token, iVar1 == 0x28 || (iVar1 == 0x124))) {
LAB_0010f193:
      luaK_exp2nextreg(fs,v);
LAB_0010f1d1:
      funcargs(ls,v);
    }
    if (iVar1 == 0x3a) {
      luaX_next(ls);
      key.u.strval = str_checkname(ls);
      key.t = -1;
      key.f = -1;
      key.k = VKSTR;
      luaK_self(fs,v,&key);
      goto LAB_0010f1d1;
    }
    if (iVar1 == 0x5b) {
      luaK_exp2anyregup(fs,v);
      yindex(ls,&key);
      luaK_indexed(fs,v,&key);
    }
    else {
      if (iVar1 == 0x7b) goto LAB_0010f193;
      if (iVar1 != 0x2e) {
        return;
      }
      fieldsel(ls,v);
    }
  } while( true );
}

Assistant:

static void suffixedexp (LexState *ls, expdesc *v) {
  /* suffixedexp ->
       primaryexp { '.' NAME | '[' exp ']' | ':' NAME funcargs | funcargs } */
  FuncState *fs = ls->fs;
  primaryexp(ls, v);
  for (;;) {
    switch (ls->t.token) {
      case '.': {  /* fieldsel */
        fieldsel(ls, v);
        break;
      }
      case '[': {  /* '[' exp ']' */
        expdesc key;
        luaK_exp2anyregup(fs, v);
        yindex(ls, &key);
        luaK_indexed(fs, v, &key);
        break;
      }
      case ':': {  /* ':' NAME funcargs */
        expdesc key;
        luaX_next(ls);
        codename(ls, &key);
        luaK_self(fs, v, &key);
        funcargs(ls, v);
        break;
      }
      case '(': case TK_STRING: case '{': {  /* funcargs */
        luaK_exp2nextreg(fs, v);
        funcargs(ls, v);
        break;
      }
      default: return;
    }
  }
}